

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall QtMWidgets::DateTimePickerPrivate::updateTimeSpec(DateTimePickerPrivate *this)

{
  undefined8 uVar1;
  undefined8 in_RAX;
  TimeSpec TVar2;
  undefined8 local_18;
  
  TVar2 = (TimeSpec)&local_18;
  local_18 = in_RAX;
  QDateTime::toTimeSpec(TVar2);
  uVar1 = *(undefined8 *)&this->minimum;
  *(undefined8 *)&this->minimum = local_18;
  local_18 = uVar1;
  QDateTime::~QDateTime((QDateTime *)&local_18);
  QDateTime::toTimeSpec(TVar2);
  uVar1 = *(undefined8 *)&this->maximum;
  *(undefined8 *)&this->maximum = local_18;
  local_18 = uVar1;
  QDateTime::~QDateTime((QDateTime *)&local_18);
  QDateTime::toTimeSpec(TVar2);
  uVar1 = *(undefined8 *)&this->value;
  *(undefined8 *)&this->value = local_18;
  local_18 = uVar1;
  QDateTime::~QDateTime((QDateTime *)&local_18);
  return;
}

Assistant:

void
DateTimePickerPrivate::updateTimeSpec()
{
	minimum = minimum.toTimeSpec( spec );
	maximum = maximum.toTimeSpec( spec );
	value = value.toTimeSpec( spec );
}